

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

char * lws_json_simple_find(char *buf,size_t len,char *name,size_t *alen)

{
  char cVar1;
  char cVar2;
  size_t nl;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  nl = strlen(name);
  pcVar3 = lws_nstrstr(buf,len,name,nl);
  pcVar6 = buf + len;
  pcVar4 = pcVar3 + nl;
  if (pcVar4 < pcVar6 && pcVar3 != (char *)0x0) {
    pcVar3 = pcVar3 + nl;
    do {
      cVar1 = *pcVar4;
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        pcVar5 = pcVar4 + (cVar1 == '\"');
        goto joined_r0x0010c193;
      }
      pcVar4 = pcVar4 + 1;
      pcVar3 = pcVar3 + 1;
    } while (pcVar4 < pcVar6);
  }
  return (char *)0x0;
joined_r0x0010c193:
  if (pcVar6 <= pcVar5) {
LAB_0010c1d2:
    *alen = (ulong)(((int)pcVar5 - (uint)(cVar1 == '\"')) - (int)pcVar3);
    return pcVar4 + (cVar1 == '\"');
  }
  cVar2 = *pcVar5;
  if (cVar1 == '\"') {
    if (cVar2 == '\"') goto LAB_0010c1d2;
    pcVar5 = pcVar5 + (cVar2 == '\\');
  }
  else if (((cVar2 == ',') || (cVar2 == ']')) || (cVar2 == '}')) goto LAB_0010c1d2;
  pcVar5 = pcVar5 + 1;
  goto joined_r0x0010c193;
}

Assistant:

const char *
lws_json_simple_find(const char *buf, size_t len, const char *name, size_t *alen)
{
	size_t nl = strlen(name);
	const char *np = lws_nstrstr(buf, len, name, nl),
		   *end = buf + len, *as;
	int qu = 0;

	if (!np)
		return NULL;

	np += nl;

	while (np < end && (*np == ' ' || *np == '\t'))
		np++;

	if (np >= end)
		return NULL;

	/*
	 * The arg could be lots of things after "name": with JSON, commonly a
	 * string like "mystring", true, false, null, [...] or {...} ... we want
	 * to handle common, simple cases cheaply with this; the user can choose
	 * a full JSON parser like lejp if it's complicated.  So if no opening
	 * quote, return until a terminator like , ] }.  If there's an opening
	 * quote, return until closing quote, handling escaped quotes.
	 */

	if (*np == '\"') {
		qu = 1;
		np++;
	}

	as = np;
	while (np < end &&
	       (!qu || *np != '\"') && /* end quote is EOT if quoted */
	       (qu || (*np != '}' && *np != ']' && *np != ',')) /* delimiters */
	) {
		if (qu && *np == '\\') /* skip next char if quoted escape */
			np++;
		np++;
	}

	*alen = (unsigned int)lws_ptr_diff(np, as);

	return as;
}